

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  double dVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  lua_Number lVar8;
  
  if (((l->tt_ & 0xf) != 3) || (bVar2 = r->tt_, (bVar2 & 0xf) != 3)) {
    if (((l->tt_ & 0xf) == 4) && ((r->tt_ & 0xf) == 4)) {
      iVar5 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
      return (int)(iVar5 < 1);
    }
    iVar5 = luaT_callorderTM(L,l,r,TM_LE);
    return iVar5;
  }
  if (l->tt_ == 3) {
    lVar3 = (l->value_).i;
    if (bVar2 == 3) {
      bVar4 = lVar3 <= (r->value_).i;
      goto LAB_0011e2ec;
    }
    dVar1 = (r->value_).n;
    if (0x40000000000000 < lVar3 + 0x20000000000000U) {
      dVar7 = floor(dVar1);
      bVar6 = 0.0 < dVar1;
      bVar4 = lVar3 <= (long)dVar7;
      if (9.223372036854776e+18 <= dVar7) {
        bVar4 = bVar6;
      }
LAB_0011e2e9:
      if (dVar7 < -9.223372036854776e+18) {
        bVar4 = bVar6;
      }
      goto LAB_0011e2ec;
    }
    bVar6 = dVar1 < (double)lVar3;
  }
  else {
    dVar1 = (l->value_).n;
    if (bVar2 == 0x13) {
      lVar8 = (r->value_).n;
    }
    else {
      lVar3 = (r->value_).i;
      if (0x40000000000000 < lVar3 + 0x20000000000000U) {
        dVar7 = floor(dVar1);
        dVar7 = (double)(~-(ulong)(dVar7 != dVar1) & (ulong)dVar7 |
                        (ulong)(dVar7 + 1.0) & -(ulong)(dVar7 != dVar1));
        bVar6 = dVar1 < 0.0;
        bVar4 = (long)dVar7 <= lVar3;
        if (9.223372036854776e+18 <= dVar7) {
          bVar4 = bVar6;
        }
        goto LAB_0011e2e9;
      }
      lVar8 = (lua_Number)lVar3;
    }
    bVar6 = lVar8 < dVar1;
  }
  bVar4 = !bVar6;
LAB_0011e2ec:
  return (int)bVar4;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else return lessequalothers(L, l, r);
}